

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

char * ImStrdup(char *str)

{
  size_t sVar1;
  void *__dest;
  char *pcVar2;
  
  sVar1 = strlen(str);
  __dest = ImGui::MemAlloc(sVar1 + 1);
  pcVar2 = (char *)memcpy(__dest,str,sVar1 + 1);
  return pcVar2;
}

Assistant:

char* ImStrdup(const char* str)
{
    size_t len = strlen(str);
    void* buf = IM_ALLOC(len + 1);
    return (char*)memcpy(buf, (const void*)str, len + 1);
}